

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

bool __thiscall slang::SVInt::isSignExtendedFrom(SVInt *this,bitwidth_t msb)

{
  bool bVar1;
  uint32_t bit_00;
  uint32_t word_00;
  uint32_t numWords_00;
  ulong uVar2;
  bool local_51;
  uint32_t numWords;
  uint32_t word;
  uint32_t bit;
  uint64_t signBits;
  ulong uStack_28;
  bitwidth_t bitsInMsw;
  uint64_t maskMsw;
  SVInt *pSStack_18;
  bitwidth_t msb_local;
  SVInt *this_local;
  
  if (msb < (this->super_SVIntStorage).bitWidth - 1) {
    maskMsw._4_4_ = msb;
    pSStack_18 = this;
    getTopWordMask(this,(bitwidth_t *)((long)&signBits + 4),&stack0xffffffffffffffd8);
    bVar1 = isSingleWord(this);
    if (bVar1) {
      uVar2 = (this->super_SVIntStorage).field_0.val >> ((byte)maskMsw._4_4_ & 0x3f);
      local_51 = uVar2 == 0 || uVar2 == uStack_28 >> ((byte)maskMsw._4_4_ & 0x3f);
      this_local._7_1_ = local_51;
    }
    else {
      bit_00 = whichBit(maskMsw._4_4_);
      word_00 = whichWord(maskMsw._4_4_);
      numWords_00 = getNumWords((this->super_SVIntStorage).bitWidth,false);
      bVar1 = isSignExtended((this->super_SVIntStorage).field_0.pVal,numWords_00,word_00,bit_00,
                             uStack_28);
      if (bVar1) {
        if (((this->super_SVIntStorage).unknownFlag & 1U) == 0) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ =
               isSignExtended((this->super_SVIntStorage).field_0.pVal + numWords_00,numWords_00,
                              word_00,bit_00,uStack_28);
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SVInt::isSignExtendedFrom(bitwidth_t msb) const {
    if (msb >= bitWidth - 1)
        return true;

    uint64_t maskMsw;
    bitwidth_t bitsInMsw;
    getTopWordMask(bitsInMsw, maskMsw);

    if (isSingleWord()) {
        auto signBits = val >> msb;
        return !signBits || signBits == maskMsw >> msb;
    }

    auto bit = whichBit(msb);
    auto word = whichWord(msb);
    auto numWords = getNumWords(bitWidth, false);

    if (!isSignExtended(pVal, numWords, word, bit, maskMsw))
        return false;

    if (!unknownFlag)
        return true;

    return isSignExtended(pVal + numWords, numWords, word, bit, maskMsw);
}